

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandSynch(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  uint local_68;
  uint local_64;
  int fVerbose;
  int nWords;
  int c;
  int fDelete2;
  int fDelete1;
  int nArgcNew;
  char **pArgvNew;
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pNtk2;
  Abc_Ntk_t *pNtk1;
  Abc_Ntk_t *pNtkRes;
  char **argv_local;
  Abc_Frame_t *pAStack_18;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtkRes = (Abc_Ntk_t *)argv;
  argv_local._4_4_ = argc;
  pAStack_18 = pAbc;
  pArgvNew = (char **)Abc_FrameReadNtk(pAbc);
  local_64 = 0x20;
  local_68 = 1;
  Extra_UtilGetoptReset();
  while( true ) {
    while( true ) {
      iVar1 = Extra_UtilGetopt(argv_local._4_4_,(char **)pNtkRes,"Wvh");
      if (iVar1 == -1) {
        _fDelete1 = pNtkRes->nObjCounts + (long)globalUtilOptind * 2 + -0x18;
        fDelete2 = argv_local._4_4_ - globalUtilOptind;
        if (fDelete2 == 0) {
          if (pArgvNew == (char **)0x0) {
            Abc_Print(-1,"Empty network.\n");
            return 1;
          }
          pNtk1 = Abc_NtkDarSynchOne((Abc_Ntk_t *)pArgvNew,local_64,local_68);
        }
        else {
          iVar1 = Abc_NtkPrepareTwoNtks
                            (_stdout,(Abc_Ntk_t *)pArgvNew,(char **)_fDelete1,fDelete2,&pNtk2,&pNtk,
                             &c,&nWords,1);
          if (iVar1 == 0) {
            return 1;
          }
          iVar1 = Abc_NtkLatchNum(pNtk2);
          if ((iVar1 == 0) || (iVar1 = Abc_NtkLatchNum(pNtk), iVar1 == 0)) {
            if (c != 0) {
              Abc_NtkDelete(pNtk2);
            }
            if (nWords != 0) {
              Abc_NtkDelete(pNtk);
            }
            Abc_Print(-1,"The network has no latches..\n");
            return 0;
          }
          pNtk1 = Abc_NtkDarSynch(pNtk2,pNtk,local_64,local_68);
          if (c != 0) {
            Abc_NtkDelete(pNtk2);
          }
          if (nWords != 0) {
            Abc_NtkDelete(pNtk);
          }
        }
        if (pNtk1 == (Abc_Ntk_t *)0x0) {
          Abc_Print(-1,"Synchronization has failed.\n");
          return 0;
        }
        Abc_FrameReplaceCurrentNetwork(pAStack_18,pNtk1);
        return 0;
      }
      if (iVar1 == 0x57) break;
      if ((iVar1 == 0x68) || (iVar1 != 0x76)) goto LAB_0028c6eb;
      local_68 = local_68 ^ 1;
    }
    if (argv_local._4_4_ <= globalUtilOptind) break;
    local_64 = atoi(*(char **)(pNtkRes->nObjCounts + (long)globalUtilOptind * 2 + -0x18));
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)local_64 < 1) {
LAB_0028c6eb:
      Abc_Print(-2,"usage: synch [-W <num>] [-vh] <file1> <file2>\n");
      Abc_Print(-2,"\t         derives and applies synchronization sequence\n");
      Abc_Print(-2,"\t-W num : the number of simulation words [default = %d]\n",(ulong)local_64);
      pcVar2 = "no";
      if (local_68 != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar2);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      Abc_Print(-2,"\tfile1  : (optional) the file with the first design\n");
      Abc_Print(-2,"\tfile2  : (optional) the file with the second design\n\n");
      Abc_Print(-2,"\t         If no designs are given on the command line,\n");
      Abc_Print(-2,"\t         assumes the current network has no initial state,\n");
      Abc_Print(-2,"\t         derives synchronization sequence and applies it.\n\n");
      Abc_Print(-2,"\t         If two designs are given on the command line\n");
      Abc_Print(-2,"\t         assumes both of them have no initial state,\n");
      Abc_Print(-2,"\t         derives sequences for both designs, synchorinizes\n");
      Abc_Print(-2,"\t         them, and creates SEC miter comparing two designs.\n\n");
      Abc_Print(-2,"\t         If only one design is given on the command line,\n");
      Abc_Print(-2,"\t         considers the second design to be the current network,\n");
      Abc_Print(-2,"\t         and derives SEC miter for them, as described above.\n");
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-W\" should be followed by an integer.\n");
  goto LAB_0028c6eb;
}

Assistant:

int Abc_CommandSynch( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtkRes, * pNtk1, * pNtk2, * pNtk;
    char ** pArgvNew;
    int nArgcNew;
    int fDelete1, fDelete2;
    int c;
    int nWords;
    int fVerbose;

    extern Abc_Ntk_t * Abc_NtkDarSynch( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nWords, int fVerbose );
    extern Abc_Ntk_t * Abc_NtkDarSynchOne( Abc_Ntk_t * pNtk, int nWords, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    nWords   =  32;
    fVerbose =   1;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Wvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nWords <= 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew == 0 )
    {
        if ( pNtk == NULL )
        {
            Abc_Print( -1, "Empty network.\n" );
            return 1;
        }
        pNtkRes = Abc_NtkDarSynchOne( pNtk, nWords, fVerbose );
    }
    else
    {
        if ( !Abc_NtkPrepareTwoNtks( stdout, pNtk, pArgvNew, nArgcNew, &pNtk1, &pNtk2, &fDelete1, &fDelete2, 1 ) )
            return 1;
        if ( Abc_NtkLatchNum(pNtk1) == 0 || Abc_NtkLatchNum(pNtk2) == 0 )
        {
            if ( fDelete1 ) Abc_NtkDelete( pNtk1 );
            if ( fDelete2 ) Abc_NtkDelete( pNtk2 );
            Abc_Print( -1, "The network has no latches..\n" );
            return 0;
        }

        // modify the current network
        pNtkRes = Abc_NtkDarSynch( pNtk1, pNtk2, nWords, fVerbose );
        if ( fDelete1 ) Abc_NtkDelete( pNtk1 );
        if ( fDelete2 ) Abc_NtkDelete( pNtk2 );
    }
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Synchronization has failed.\n" );
        return 0;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: synch [-W <num>] [-vh] <file1> <file2>\n" );
    Abc_Print( -2, "\t         derives and applies synchronization sequence\n" );
    Abc_Print( -2, "\t-W num : the number of simulation words [default = %d]\n", nWords );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\tfile1  : (optional) the file with the first design\n");
    Abc_Print( -2, "\tfile2  : (optional) the file with the second design\n\n");
    Abc_Print( -2, "\t         If no designs are given on the command line,\n" );
    Abc_Print( -2, "\t         assumes the current network has no initial state,\n" );
    Abc_Print( -2, "\t         derives synchronization sequence and applies it.\n\n" );
    Abc_Print( -2, "\t         If two designs are given on the command line\n" );
    Abc_Print( -2, "\t         assumes both of them have no initial state,\n" );
    Abc_Print( -2, "\t         derives sequences for both designs, synchorinizes\n" );
    Abc_Print( -2, "\t         them, and creates SEC miter comparing two designs.\n\n" );
    Abc_Print( -2, "\t         If only one design is given on the command line,\n" );
    Abc_Print( -2, "\t         considers the second design to be the current network,\n" );
    Abc_Print( -2, "\t         and derives SEC miter for them, as described above.\n" );
    return 1;
}